

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

int assetsys_file_count(assetsys_t *sys,char *path)

{
  int iVar1;
  int local_2c;
  int local_28;
  int i;
  int count;
  int dir;
  char *path_local;
  assetsys_t *sys_local;
  
  if (path == (char *)0x0) {
    sys_local._4_4_ = 0;
  }
  else {
    iVar1 = assetsys_internal_find_collated(sys,path);
    local_28 = 0;
    for (local_2c = 0; local_2c < sys->collated_count; local_2c = local_2c + 1) {
      if ((sys->collated[local_2c].is_file != 0) && (sys->collated[local_2c].parent == iVar1)) {
        local_28 = local_28 + 1;
      }
    }
    sys_local._4_4_ = local_28;
  }
  return sys_local._4_4_;
}

Assistant:

int assetsys_file_count( assetsys_t* sys, char const* path )
    {
    if( !path ) return 0;
    int dir = assetsys_internal_find_collated( sys, path );
    int count = 0;
    for( int i = 0; i < sys->collated_count; ++i )
        {
        if( sys->collated[ i ].is_file && sys->collated[ i ].parent == dir )
            {
            ++count;
            }
        }
    return count;
    }